

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atomic64_gcc_x86_64.h
# Opt level: O0

int32_t aeron::concurrent::atomic::cmpxchg(int32_t *destination,int32_t expected,int32_t desired)

{
  int iVar1;
  int32_t original;
  int32_t desired_local;
  int32_t expected_local;
  int32_t *destination_local;
  
  LOCK();
  iVar1 = *destination;
  if (expected == iVar1) {
    *destination = desired;
    iVar1 = expected;
  }
  UNLOCK();
  return iVar1;
}

Assistant:

inline std::int32_t cmpxchg(volatile std::int32_t* destination,  std::int32_t expected, std::int32_t desired)
{
    std::int32_t original;
    asm volatile(
        "lock; cmpxchgl %2, %1"
        : "=a"(original), "+m"(*destination)
        : "q"(desired), "0"(expected));
    return original;
}